

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O3

bool lunasvg::parseUrlValue(string_view *input,string *value)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  size_t sVar6;
  long lVar7;
  byte *pbVar8;
  byte *pbVar9;
  size_t sVar10;
  ulong uVar11;
  string_view local_30;
  
  local_30._M_len = 3;
  local_30._M_str = "url";
  bVar5 = skipString(input,&local_30);
  if (!bVar5) {
    return false;
  }
  sVar3 = input->_M_len;
  if (sVar3 == 0) {
    return false;
  }
  pcVar4 = input->_M_str;
  sVar10 = 0;
  sVar6 = sVar3;
  while( true ) {
    sVar6 = sVar6 - 1;
    uVar11 = (ulong)(byte)pcVar4[sVar10];
    if (0x28 < uVar11) {
      return false;
    }
    if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) break;
    input->_M_str = pcVar4 + sVar10 + 1;
    input->_M_len = sVar6;
    sVar10 = sVar10 + 1;
    if (sVar10 == sVar3) {
      return false;
    }
  }
  if (uVar11 != 0x28) {
    return false;
  }
  input->_M_str = pcVar4 + sVar10 + 1;
  input->_M_len = sVar6;
  if (sVar10 - sVar3 == -1) {
    return false;
  }
  lVar7 = -2 - sVar10;
  while (((ulong)(byte)pcVar4[sVar10 + 1] < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)pcVar4[sVar10 + 1] & 0x3f) & 1) != 0))) {
    input->_M_str = pcVar4 + sVar10 + 2;
    input->_M_len = sVar3 + lVar7;
    sVar10 = sVar10 + 1;
    lVar7 = lVar7 + -1;
    if (sVar3 - 1 == sVar10) {
      return false;
    }
  }
  bVar1 = pcVar4[sVar10 + 1];
  if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
    input->_M_str = pcVar4 + sVar10 + 2;
    input->_M_len = lVar7 + sVar3;
    if (sVar3 - 2 == sVar10) {
      return false;
    }
    sVar6 = (sVar3 - sVar10) - 3;
    pbVar9 = (byte *)(pcVar4 + sVar10 + 3);
    while( true ) {
      uVar11 = (ulong)pbVar9[-1];
      if (0x23 < uVar11) {
        return false;
      }
      if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) break;
      input->_M_str = (char *)pbVar9;
      input->_M_len = sVar6;
      pbVar9 = pbVar9 + 1;
      bVar5 = sVar6 == 0;
      sVar6 = sVar6 - 1;
      if (bVar5) {
        return false;
      }
    }
    if (uVar11 != 0x23) {
      return false;
    }
    input->_M_str = (char *)pbVar9;
    input->_M_len = sVar6;
    while( true ) {
      if (sVar6 == 0) {
        return false;
      }
      bVar2 = *pbVar9;
      if (bVar2 == bVar1) break;
      std::__cxx11::string::push_back((char)value);
      pbVar9 = (byte *)(input->_M_str + 1);
      input->_M_str = (char *)pbVar9;
      sVar6 = input->_M_len - 1;
      input->_M_len = sVar6;
    }
    while( true ) {
      sVar6 = sVar6 - 1;
      pbVar8 = pbVar9 + 1;
      if ((0x20 < bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
      input->_M_str = (char *)pbVar8;
      input->_M_len = sVar6;
      if (sVar6 == 0) {
        return false;
      }
      bVar2 = *pbVar8;
      pbVar9 = pbVar8;
    }
    if (*pbVar9 != bVar1) {
      return false;
    }
    input->_M_str = (char *)pbVar8;
    input->_M_len = sVar6;
    if (sVar6 == 0) {
      return false;
    }
  }
  else {
    if (bVar1 != 0x23) {
      return false;
    }
    pbVar8 = (byte *)(pcVar4 + sVar10 + 2);
    input->_M_str = (char *)pbVar8;
    sVar6 = lVar7 + sVar3;
    input->_M_len = sVar6;
    if (sVar3 - 2 == sVar10) {
      return false;
    }
    while (*pbVar8 != 0x29) {
      std::__cxx11::string::push_back((char)value);
      pbVar8 = (byte *)(input->_M_str + 1);
      input->_M_str = (char *)pbVar8;
      sVar6 = input->_M_len - 1;
      input->_M_len = sVar6;
      if (sVar6 == 0) {
        return false;
      }
    }
  }
  while( true ) {
    sVar6 = sVar6 - 1;
    pbVar9 = pbVar8 + 1;
    uVar11 = (ulong)*pbVar8;
    if (0x29 < uVar11) {
      return false;
    }
    if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) break;
    input->_M_str = (char *)pbVar9;
    input->_M_len = sVar6;
    pbVar8 = pbVar9;
    if (sVar6 == 0) {
      return false;
    }
  }
  if (uVar11 == 0x29) {
    input->_M_str = (char *)pbVar9;
    input->_M_len = sVar6;
    return true;
  }
  return false;
}

Assistant:

static bool parseUrlValue(std::string_view& input, std::string& value)
{
    if(!skipString(input, "url")
        || !skipOptionalSpaces(input)
        || !skipDelimiter(input, '(')
        || !skipOptionalSpaces(input)) {
        return false;
    }

    switch(input.front()) {
    case '\'':
    case '\"': {
        auto delim = input.front();
        input.remove_prefix(1);
        skipOptionalSpaces(input);
        if(!skipDelimiter(input, '#'))
            return false;
        while(!input.empty() && input.front() != delim) {
            value += input.front();
            input.remove_prefix(1);
        }

        skipOptionalSpaces(input);
        if(!skipDelimiter(input, delim))
            return false;
        break;
    } case '#': {
        input.remove_prefix(1);
        while(!input.empty() && input.front() != ')') {
            value += input.front();
            input.remove_prefix(1);
        }

        break;
    } default:
        return false;
    }

    return skipOptionalSpaces(input) && skipDelimiter(input, ')');
}